

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::PaddingLayerParams::Clear(PaddingLayerParams *this)

{
  ulong uVar1;
  BorderAmounts *this_00;
  undefined8 *puVar2;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if ((puVar2 == (undefined8 *)0x0) &&
     (this_00 = this->paddingamounts_, this_00 != (BorderAmounts *)0x0)) {
    BorderAmounts::~BorderAmounts(this_00);
    operator_delete(this_00,0x30);
  }
  this->paddingamounts_ = (BorderAmounts *)0x0;
  clear_PaddingType(this);
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void PaddingLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.PaddingLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  if (GetArenaForAllocation() == nullptr && paddingamounts_ != nullptr) {
    delete paddingamounts_;
  }
  paddingamounts_ = nullptr;
  clear_PaddingType();
  _internal_metadata_.Clear<std::string>();
}